

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::CopyDeferredRows(Codec *this)

{
  long in_RDI;
  uint64_t *compress_row;
  uint16_t defer_row_i;
  uint16_t ge_row_i;
  uint64_t *ge_row;
  undefined2 local_14;
  undefined2 local_12;
  undefined8 local_10;
  
  local_10 = (void *)(*(long *)(in_RDI + 0x98) +
                     (ulong)(*(int *)(in_RDI + 0xa8) * (uint)*(ushort *)(in_RDI + 10)) * 8);
  local_12 = *(ushort *)(in_RDI + 10);
  for (local_14 = *(ushort *)(in_RDI + 0x8c); local_14 != 0xffff;
      local_14 = *(ushort *)(*(long *)(in_RDI + 0x60) + (ulong)local_14 * 0x18 + 4)) {
    memcpy(local_10,(void *)(*(long *)(in_RDI + 0x90) +
                            (ulong)(*(int *)(in_RDI + 0xa8) * (uint)local_14) * 8),
           (ulong)*(uint *)(in_RDI + 0xa8) << 3);
    *(ushort *)(*(long *)(in_RDI + 0xd0) + (ulong)local_12 * 2) = local_14;
    local_12 = local_12 + 1;
    local_10 = (void *)((long)local_10 + (ulong)*(uint *)(in_RDI + 0xa8) * 8);
  }
  return;
}

Assistant:

void Codec::CopyDeferredRows()
{
    CAT_IF_DUMP(cout << endl << "---- CopyDeferredRows ----" << endl << endl;)

    // Get GE matrix row starting at dense rows
    uint64_t * GF256_RESTRICT ge_row = _ge_matrix + _ge_pitch * _dense_count;

    // For each deferred row:
    for (uint16_t ge_row_i = _dense_count, defer_row_i = _defer_head_rows;
        defer_row_i != LIST_TERM;
        ++ge_row_i, ge_row += _ge_pitch)
    {
        CAT_IF_DUMP(cout << "Peeled row " << defer_row_i << " for GE row " << ge_row_i << endl;)

        // Get Compress matrix row
        uint64_t * GF256_RESTRICT compress_row = _compress_matrix + _ge_pitch * defer_row_i;

        // Copy Compress row to GE row
        memcpy(ge_row, compress_row, _ge_pitch * sizeof(uint64_t));

        // Set row map for this deferred row
        _ge_row_map[ge_row_i] = defer_row_i;

        // Get next deferred row from peeling solver output
        defer_row_i = _peel_rows[defer_row_i].NextRow;
    }
}